

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivySeq.c
# Opt level: O0

uint Ivy_CutGetTruth_rec(Ivy_Man_t *p,int Leaf,int *pNums,int nNums)

{
  int iVar1;
  int iVar2;
  Ivy_Obj_t *pObj_00;
  int local_44;
  int i;
  Ivy_Obj_t *pObj;
  uint local_30;
  uint uTruth1;
  uint uTruth0;
  int nNums_local;
  int *pNums_local;
  int Leaf_local;
  Ivy_Man_t *p_local;
  
  for (local_44 = 0; local_44 < nNums; local_44 = local_44 + 1) {
    if (Leaf == pNums[local_44]) {
      return Ivy_CutGetTruth_rec::uMasks[local_44];
    }
  }
  iVar1 = Ivy_LeafId(Leaf);
  pObj_00 = Ivy_ManObj(p,iVar1);
  iVar1 = Ivy_ObjIsLatch(pObj_00);
  if (iVar1 == 0) {
    iVar1 = Ivy_ObjIsNode(pObj_00);
    if ((iVar1 == 0) && (iVar1 = Ivy_ObjIsBuf(pObj_00), iVar1 == 0)) {
      __assert_fail("Ivy_ObjIsNode(pObj) || Ivy_ObjIsBuf(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivySeq.c"
                    ,0x240,"unsigned int Ivy_CutGetTruth_rec(Ivy_Man_t *, int, int *, int)");
    }
    iVar1 = Ivy_ObjFaninId0(pObj_00);
    iVar2 = Ivy_LeafLat(Leaf);
    iVar1 = Ivy_LeafCreate(iVar1,iVar2);
    local_30 = Ivy_CutGetTruth_rec(p,iVar1,pNums,nNums);
    iVar2 = Ivy_ObjFaninC0(pObj_00);
    if (iVar2 != 0) {
      local_30 = local_30 ^ 0xffffffff;
    }
    iVar2 = Ivy_ObjIsBuf(pObj_00);
    if (iVar2 == 0) {
      iVar2 = Ivy_ObjFaninId1(pObj_00);
      iVar1 = Ivy_LeafLat(iVar1);
      iVar1 = Ivy_LeafCreate(iVar2,iVar1);
      pObj._4_4_ = Ivy_CutGetTruth_rec(p,iVar1,pNums,nNums);
      iVar1 = Ivy_ObjFaninC1(pObj_00);
      if (iVar1 != 0) {
        pObj._4_4_ = pObj._4_4_ ^ 0xffffffff;
      }
      p_local._4_4_ = local_30 & pObj._4_4_;
    }
    else {
      p_local._4_4_ = local_30;
    }
  }
  else {
    iVar1 = Ivy_ObjFaninC0(pObj_00);
    if (iVar1 != 0) {
      __assert_fail("!Ivy_ObjFaninC0(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivySeq.c"
                    ,0x23c,"unsigned int Ivy_CutGetTruth_rec(Ivy_Man_t *, int, int *, int)");
    }
    iVar1 = Ivy_ObjFaninId0(pObj_00);
    iVar2 = Ivy_LeafLat(Leaf);
    iVar1 = Ivy_LeafCreate(iVar1,iVar2 + 1);
    p_local._4_4_ = Ivy_CutGetTruth_rec(p,iVar1,pNums,nNums);
  }
  return p_local._4_4_;
}

Assistant:

unsigned Ivy_CutGetTruth_rec( Ivy_Man_t * p, int Leaf, int * pNums, int nNums )
{
    static unsigned uMasks[5] = { 0xAAAAAAAA, 0xCCCCCCCC, 0xF0F0F0F0, 0xFF00FF00, 0xFFFF0000 };
    unsigned uTruth0, uTruth1;
    Ivy_Obj_t * pObj;
    int i;
    for ( i = 0; i < nNums; i++ )
        if ( Leaf == pNums[i] )
            return uMasks[i];
    pObj = Ivy_ManObj( p, Ivy_LeafId(Leaf) );
    if ( Ivy_ObjIsLatch(pObj) )
    {
        assert( !Ivy_ObjFaninC0(pObj) );
        Leaf = Ivy_LeafCreate( Ivy_ObjFaninId0(pObj), Ivy_LeafLat(Leaf) + 1 );
        return Ivy_CutGetTruth_rec( p, Leaf, pNums, nNums );
    }
    assert( Ivy_ObjIsNode(pObj) || Ivy_ObjIsBuf(pObj) );
    Leaf = Ivy_LeafCreate( Ivy_ObjFaninId0(pObj), Ivy_LeafLat(Leaf) );
    uTruth0 = Ivy_CutGetTruth_rec( p, Leaf, pNums, nNums );
    if ( Ivy_ObjFaninC0(pObj) )
        uTruth0 = ~uTruth0;
    if ( Ivy_ObjIsBuf(pObj) )
        return uTruth0;
    Leaf = Ivy_LeafCreate( Ivy_ObjFaninId1(pObj), Ivy_LeafLat(Leaf) );
    uTruth1 = Ivy_CutGetTruth_rec( p, Leaf, pNums, nNums );
    if ( Ivy_ObjFaninC1(pObj) )
        uTruth1 = ~uTruth1;
    return uTruth0 & uTruth1;
}